

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::SimpleFieldComparator::Tolerance>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  bool bVar8;
  ulong uVar9;
  uint64_t v;
  size_t sVar10;
  long *plVar11;
  size_t sVar12;
  ctrl_t cVar13;
  ulong uVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar8 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,true,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,8,0x18);
    if ((local_48 != 0) && (!bVar8)) {
      if ((char)local_3f == '\x01') {
        __assert_fail("!was_soo_",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7c2,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
      plVar11 = (long *)CONCAT44(local_58._12_4_,local_58._8_4_);
      sVar12 = 0;
      sVar10 = local_48;
      do {
        if ((char)local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7be,
                        "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
        }
        if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar12)) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + *plVar11;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0) ^
                         SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8)) + *plVar11;
          uVar14 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
          FVar15 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar14);
          uVar9 = FVar15.offset;
          uVar3 = common->capacity_;
          if (uVar3 <= uVar9) {
            __assert_fail("i < c.capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x70c,
                          "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                         );
          }
          cVar13 = (ctrl_t)uVar14 & ~kEmpty;
          pcVar4 = (common->heap_or_soo_).heap.control;
          pcVar4[uVar9] = cVar13;
          pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar9 - 0xf & uVar3)] = cVar13;
          *(long *)(lVar2 + 0x10 + uVar9 * 0x18) = plVar11[2];
          lVar7 = plVar11[1];
          plVar1 = (long *)(lVar2 + uVar9 * 0x18);
          *plVar1 = *plVar11;
          plVar1[1] = lVar7;
          sVar10 = local_48;
        }
        sVar12 = sVar12 + 1;
        plVar11 = plVar11 + 3;
      } while (sVar12 != sVar10);
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x18);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::SimpleFieldComparator::Tolerance>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::SimpleFieldComparator::Tolerance>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::SimpleFieldComparator::Tolerance>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::SimpleFieldComparator::Tolerance>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }